

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O2

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::InitBuild
          (RTCPCompoundPacketBuilder *this,void *externalbuffer,size_t buffersize)

{
  int iVar1;
  
  if (this->arebuilding == false) {
    if ((this->super_RTCPCompoundPacket).compoundpacket == (uint8_t *)0x0) {
      if (599 < buffersize) {
        this->maximumpacketsize = buffersize;
        this->buffer = (uint8_t *)externalbuffer;
        this->external = true;
        this->arebuilding = true;
        this->byesize = 0;
        this->appsize = 0;
        return 0;
      }
      iVar1 = -0x23;
    }
    else {
      iVar1 = -0x20;
    }
  }
  else {
    iVar1 = -0x1f;
  }
  return iVar1;
}

Assistant:

int RTCPCompoundPacketBuilder::InitBuild(void *externalbuffer,size_t buffersize)
{
	if (arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ALREADYBUILDING;
	if (compoundpacket)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ALREADYBUILT;

	if (buffersize < RTP_MINPACKETSIZE)
		return ERR_RTP_RTCPCOMPPACKBUILDER_BUFFERSIZETOOSMALL;

	maximumpacketsize = buffersize;
	buffer = (uint8_t *)externalbuffer;
	external = true;
	byesize = 0;
	appsize = 0;
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	unknownsize = 0;
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	arebuilding = true;
	return 0;
}